

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

char * leveldb::GetVarint64Ptr(char *p,char *limit,uint64_t *value)

{
  byte bVar1;
  uint64_t byte;
  ulong uStack_30;
  uint32_t shift;
  uint64_t result;
  uint64_t *value_local;
  char *limit_local;
  char *p_local;
  
  uStack_30 = 0;
  byte._4_4_ = 0;
  limit_local = p;
  while( true ) {
    if (0x3f < byte._4_4_ || limit <= limit_local) {
      return (char *)0x0;
    }
    bVar1 = *limit_local;
    limit_local = limit_local + 1;
    if ((bVar1 & 0x80) == 0) break;
    uStack_30 = ((ulong)bVar1 & 0x7f) << ((byte)byte._4_4_ & 0x3f) | uStack_30;
    byte._4_4_ = byte._4_4_ + 7;
  }
  *value = (ulong)bVar1 << ((byte)byte._4_4_ & 0x3f) | uStack_30;
  return limit_local;
}

Assistant:

const char* GetVarint64Ptr(const char* p, const char* limit, uint64_t* value) {
  uint64_t result = 0;
  for (uint32_t shift = 0; shift <= 63 && p < limit; shift += 7) {
    uint64_t byte = *(reinterpret_cast<const unsigned char*>(p));
    p++;
    if (byte & 128) {
      // More bytes are present
      result |= ((byte & 127) << shift);
    } else {
      result |= (byte << shift);
      *value = result;
      return reinterpret_cast<const char*>(p);
    }
  }
  return nullptr;
}